

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O2

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_cap
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,double len)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double __y;
  double __x;
  double local_78;
  
  vc->m_size = 0;
  auVar9._0_8_ = v1->x - v0->x;
  auVar9._8_8_ = v1->y - v0->y;
  auVar10._8_4_ = SUB84(len,0);
  auVar10._0_8_ = len;
  auVar10._12_4_ = (int)((ulong)len >> 0x20);
  auVar10 = divpd(auVar9,auVar10);
  __y = this->m_width * auVar10._0_8_;
  __x = this->m_width * auVar10._8_8_;
  if (this->m_line_cap == round_cap) {
    dVar8 = acos(this->m_width_abs / (0.125 / this->m_approx_scale + this->m_width_abs));
    iVar6 = (int)(3.141592653589793 / (dVar8 + dVar8));
    dVar8 = 3.141592653589793 / (double)(iVar6 + 1);
    add_vertex(this,vc,v0->x - __x,v0->y + __y);
    iVar5 = 0;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    if (this->m_width_sign < 1) {
      local_78 = atan2(-__y,__x);
      while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
        local_78 = local_78 - dVar8;
        dVar11 = v0->x;
        dVar3 = cos(local_78);
        dVar1 = this->m_width;
        dVar2 = v0->y;
        dVar4 = sin(local_78);
        add_vertex(this,vc,dVar3 * dVar1 + dVar11,dVar2 + dVar4 * this->m_width);
      }
    }
    else {
      local_78 = atan2(__y,-__x);
      while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
        local_78 = local_78 + dVar8;
        dVar11 = v0->x;
        dVar3 = cos(local_78);
        dVar1 = this->m_width;
        dVar2 = v0->y;
        dVar4 = sin(local_78);
        add_vertex(this,vc,dVar3 * dVar1 + dVar11,dVar2 + dVar4 * this->m_width);
      }
    }
    dVar8 = v0->x + __x;
    dVar11 = v0->y - __y;
  }
  else {
    dVar8 = 0.0;
    dVar11 = 0.0;
    if (this->m_line_cap == square_cap) {
      dVar8 = (double)this->m_width_sign * __y;
      dVar11 = (double)this->m_width_sign * __x;
    }
    add_vertex(this,vc,(v0->x - __x) - dVar8,(v0->y + __y) - dVar11);
    dVar8 = (v0->x + __x) - dVar8;
    dVar11 = (v0->y - __y) - dVar11;
  }
  add_vertex(this,vc,dVar8,dVar11);
  return;
}

Assistant:

void math_stroke<VC>::calc_cap(VC& vc,
                                   const vertex_dist& v0, 
                                   const vertex_dist& v1, 
                                   double len)
    {
        vc.remove_all();

        double dx1 = (v1.y - v0.y) / len;
        double dy1 = (v1.x - v0.x) / len;
        double dx2 = 0;
        double dy2 = 0;

        dx1 *= m_width;
        dy1 *= m_width;

        if(m_line_cap != round_cap)
        {
            if(m_line_cap == square_cap)
            {
                dx2 = dy1 * m_width_sign;
                dy2 = dx1 * m_width_sign;
            }
            add_vertex(vc, v0.x - dx1 - dx2, v0.y + dy1 - dy2);
            add_vertex(vc, v0.x + dx1 - dx2, v0.y - dy1 - dy2);
        }
        else
        {
            double da = acos(m_width_abs / (m_width_abs + 0.125 / m_approx_scale)) * 2;
            double a1;
            int i;
            int n = int(pi / da);

            da = pi / (n + 1);
            add_vertex(vc, v0.x - dx1, v0.y + dy1);
            if(m_width_sign > 0)
            {
                a1 = atan2(dy1, -dx1);
                a1 += da;
                for(i = 0; i < n; i++)
                {
                    add_vertex(vc, v0.x + cos(a1) * m_width, 
                                   v0.y + sin(a1) * m_width);
                    a1 += da;
                }
            }
            else
            {
                a1 = atan2(-dy1, dx1);
                a1 -= da;
                for(i = 0; i < n; i++)
                {
                    add_vertex(vc, v0.x + cos(a1) * m_width, 
                                   v0.y + sin(a1) * m_width);
                    a1 -= da;
                }
            }
            add_vertex(vc, v0.x + dx1, v0.y - dy1);
        }
    }